

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nlsol_ex_mdl.h
# Opt level: O3

vector<int,_std::allocator<int>_> * __thiscall
ExampleModel::DefVarsInItem
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,ExampleModel *this,int i)

{
  initializer_list<int> __l;
  allocator_type local_11;
  undefined8 local_10;
  
  switch(i) {
  case 0:
    local_10 = 0x100000000;
    break;
  case 2:
    local_10 = 0x300000002;
    break;
  default:
    (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    return __return_storage_ptr__;
  }
  __l._M_len = 2;
  __l._M_array = (iterator)&local_10;
  std::vector<int,_std::allocator<int>_>::vector(__return_storage_ptr__,__l,&local_11);
  return __return_storage_ptr__;
}

Assistant:

std::vector<int> DefVarsInItem(int i) const {
    switch (i) {
    case -1: return {};
    case 0: return {0, 1};
    case 1:
    case 3: return {};
    case 2: return {2, 3};
    default:
      assert(0);
      return {};
    }
  }